

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O3

void Ssw_ManLoadSolver(Ssw_Man_t *p,Aig_Obj_t *pRepr,Aig_Obj_t *pObj)

{
  uint uVar1;
  void **ppvVar2;
  void *pvVar3;
  void *pvVar4;
  sat_solver *s;
  uint uVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Int_t *pVVar8;
  Aig_Obj_t *pObj_00;
  long lVar9;
  Aig_Obj_t *pObj_01;
  
  if (pRepr == pObj) {
    __assert_fail("pRepr != pObj",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                  ,0x94,"void Ssw_ManLoadSolver(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar6 = p->pPars->nFramesK;
  pObj_00 = (Aig_Obj_t *)
            ((ulong)p->pNodeToFrames[pRepr->Id * p->nFrames + iVar6] & 0xfffffffffffffffe);
  pObj_01 = (Aig_Obj_t *)
            ((ulong)p->pNodeToFrames[p->nFrames * pObj->Id + iVar6] & 0xfffffffffffffffe);
  if (pObj_00 == pObj_01) {
    __assert_fail("pReprFrames != pObjFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                  ,0x98,"void Ssw_ManLoadSolver(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  Ssw_CnfNodeAddToSolver(p->pMSat,pObj_00);
  Ssw_CnfNodeAddToSolver(p->pMSat,pObj_01);
  pVVar7 = p->vNewLos;
  pVVar7->nSize = 0;
  Ssw_ManCollectPis_rec(pObj_00,pVVar7);
  Ssw_ManCollectPis_rec(pObj_01,p->vNewLos);
  p->vNewPos->nSize = 0;
  pVVar7 = p->vNewLos;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      Ssw_ManCollectPos_rec(p,(Aig_Obj_t *)pVVar7->pArray[lVar9],p->vNewPos);
      lVar9 = lVar9 + 1;
      pVVar7 = p->vNewLos;
    } while (lVar9 < pVVar7->nSize);
    pVVar8 = p->vNewPos;
    if (0 < pVVar8->nSize) {
      lVar9 = 0;
      do {
        if (pVVar8->pArray[lVar9] < 0) {
LAB_00617967:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar5 = pVVar8->pArray[lVar9] * 2;
        pVVar7 = p->pFrames->vCos;
        uVar1 = pVVar7->nSize;
        if (((int)uVar1 <= (int)uVar5) || (uVar1 <= (uVar5 | 1))) goto LAB_00617967;
        ppvVar2 = pVVar7->pArray;
        pvVar3 = ppvVar2[uVar5];
        pvVar4 = ppvVar2[uVar5 | 1];
        if (((*(ulong *)((long)pvVar3 + 0x18) & 0x20) != 0) ||
           ((*(byte *)((long)pvVar4 + 0x18) & 0x20) != 0)) {
          *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) | 0x20;
          *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) | 0x20;
          Ssw_NodesAreConstrained
                    (p,*(Aig_Obj_t **)((long)pvVar3 + 8),*(Aig_Obj_t **)((long)pvVar4 + 8));
          pVVar8 = p->vNewPos;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar8->nSize);
    }
  }
  s = p->pMSat->pSat;
  if (s->qtail != s->qhead) {
    iVar6 = sat_solver_simplify(s);
    if (iVar6 == 0) {
      __assert_fail("RetValue != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                    ,0xc4,"void Ssw_ManLoadSolver(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  return;
}

Assistant:

void Ssw_ManLoadSolver( Ssw_Man_t * p, Aig_Obj_t * pRepr, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjFrames, * pReprFrames;
    Aig_Obj_t * pTemp, * pObj0, * pObj1;
    int i, iConstr, RetValue;

    assert( pRepr != pObj );
    // get the corresponding frames nodes
    pReprFrames = Aig_Regular( Ssw_ObjFrame( p, pRepr, p->pPars->nFramesK ) );
    pObjFrames  = Aig_Regular( Ssw_ObjFrame( p, pObj,  p->pPars->nFramesK ) );
    assert( pReprFrames != pObjFrames );
 /*
    // compute the AIG support
    Vec_PtrClear( p->vNewLos );
    Ssw_ManCollectPis_rec( pRepr, p->vNewLos );
    Ssw_ManCollectPis_rec( pObj,  p->vNewLos );
    // add logic cones for register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vNewLos, pTemp, i )
    {
        pObj0 = Aig_Regular( Ssw_ObjFrame( p, pTemp, p->pPars->nFramesK ) );
        Ssw_CnfNodeAddToSolver( p->pMSat, pObj0 );
    }
*/
    // add cones for the nodes
    Ssw_CnfNodeAddToSolver( p->pMSat, pReprFrames );
    Ssw_CnfNodeAddToSolver( p->pMSat, pObjFrames );

    // compute the frames support
    Vec_PtrClear( p->vNewLos );
    Ssw_ManCollectPis_rec( pReprFrames, p->vNewLos );
    Ssw_ManCollectPis_rec( pObjFrames,  p->vNewLos );
    // these nodes include both nodes corresponding to PIs and LOs
    // (the nodes corresponding to PIs should be labeled with fMarkB!)

    // collect the related constraint POs
    Vec_IntClear( p->vNewPos );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vNewLos, pTemp, i )
        Ssw_ManCollectPos_rec( p, pTemp, p->vNewPos );
    // check if the corresponding pairs are added
    Vec_IntForEachEntry( p->vNewPos, iConstr, i )
    {
        pObj0 = Aig_ManCo( p->pFrames, 2*iConstr   );
        pObj1 = Aig_ManCo( p->pFrames, 2*iConstr+1 );
//        if ( pObj0->fMarkB && pObj1->fMarkB )
        if ( pObj0->fMarkB || pObj1->fMarkB )
        {
            pObj0->fMarkB = 1;
            pObj1->fMarkB = 1;
            Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj0), Aig_ObjChild0(pObj1) );
        }
    }
    if ( p->pMSat->pSat->qtail != p->pMSat->pSat->qhead )
    {
        RetValue = sat_solver_simplify(p->pMSat->pSat);
        assert( RetValue != 0 );
    }
}